

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O0

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CCompExp *exp)

{
  bool bVar1;
  pointer pIVar2;
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  CCompExp *local_18;
  CCompExp *exp_local;
  CConvertVisitor *this_local;
  
  local_18 = exp;
  exp_local = (CCompExp *)this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&exp->leftOperand);
  if (bVar1) {
    pIVar2 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                       (&local_18->leftOperand);
    (**(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
  }
  std::
  map<enums::TCompareOperation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<enums::TCompareOperation>,_std::allocator<std::pair<const_enums::TCompareOperation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](&CCompExp::stringOperations_abi_cxx11_,&local_18->operation);
  std::operator+((char *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1d2af1);
  std::operator+(local_38,(char *)local_58);
  std::__cxx11::string::operator+=((string *)&this->code,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->rightOperand);
  if (bVar1) {
    pIVar2 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                       (&local_18->rightOperand);
    (**(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
  }
  return;
}

Assistant:

void CConvertVisitor::Visit(CCompExp &exp) {
	if (exp.leftOperand) {
		exp.leftOperand->Accept(*this);
	}
	this->code += " " + exp.stringOperations[exp.operation] + " ";
	if (exp.rightOperand) {
		exp.rightOperand->Accept(*this);
	}
}